

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Socket> * __thiscall
asl::Array<asl::Socket>::insert(Array<asl::Socket> *this,int k,Socket *x)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  SmartObject_ *pSVar4;
  Socket *pSVar5;
  Socket *pSVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  
  pSVar6 = this->_a;
  iVar1 = *(int *)&pSVar6[-2].super_SmartObject._p;
  iVar2 = *(int *)((long)&pSVar6[-2].super_SmartObject._p + 4);
  iVar8 = k;
  if (k < 0) {
    iVar8 = iVar1;
  }
  if (iVar1 < iVar2) {
    pSVar5 = pSVar6 + -2;
LAB_00124b76:
    if (iVar1 - iVar8 != 0 && iVar8 <= iVar1) {
      memmove(pSVar6 + (long)iVar8 + 1,pSVar6 + iVar8,(long)(iVar1 - iVar8) << 3);
      pSVar6 = this->_a;
    }
    pSVar4 = (x->super_SmartObject)._p;
    pSVar6[iVar8].super_SmartObject._p = pSVar4;
    if (pSVar4 != (SmartObject_ *)0x0) {
      LOCK();
      (pSVar4->rc).n = (pSVar4->rc).n + 1;
      UNLOCK();
    }
    *(int *)&(pSVar5->super_SmartObject)._p = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    uVar3 = *(undefined4 *)&this->_a[-1].super_SmartObject._p;
    iVar9 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar9 = iVar2 * 2 + 2;
    }
    pSVar5 = (Socket *)realloc(this->_a + -2,(long)iVar9 * 8 + 0x10);
    if (pSVar5 != (Socket *)0x0) {
      pSVar6 = pSVar5 + 2;
      this->_a = pSVar6;
      *(int *)((long)&(pSVar5->super_SmartObject)._p + 4) = iVar9;
      *(undefined4 *)&pSVar5[1].super_SmartObject._p = uVar3;
      goto LAB_00124b76;
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = dup2;
  __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}